

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::BeginMenuBar(void)

{
  float fVar1;
  ImGuiWindow *this;
  bool bVar2;
  uint uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  ImRect IVar10;
  ImRect clip_rect;
  ImVec2 local_18;
  ImVec2 IStack_10;
  
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if ((this->SkipItems == false) && ((this->Flags & 0x400) != 0)) {
    if ((this->DC).MenuBarAppending == true) {
      __assert_fail("!window->DC.MenuBarAppending",
                    "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_widgets.cpp"
                    ,0x1a24,"bool ImGui::BeginMenuBar()");
    }
    BeginGroup();
    PushID("##menubar");
    IVar10 = ImGuiWindow::MenuBarRect(this);
    fVar7 = this->WindowBorderSize;
    fVar4 = IVar10.Min.x;
    fVar9 = (float)(int)(fVar4 + fVar7 + 0.5);
    fVar6 = (float)(int)(IVar10.Min.y + fVar7 + 0.5);
    uVar3 = -(uint)(fVar7 <= this->WindowRounding);
    fVar7 = IVar10.Max.x - (float)(~uVar3 & (uint)fVar7 | (uint)this->WindowRounding & uVar3);
    uVar3 = -(uint)(fVar7 <= fVar4);
    fVar8 = (float)(int)((float)(uVar3 & (uint)fVar4 | ~uVar3 & (uint)fVar7) + 0.5);
    fVar5 = (float)(int)(IVar10.Max.y + 0.5);
    fVar7 = (this->OuterRectClipped).Min.x;
    fVar1 = (this->OuterRectClipped).Min.y;
    uVar3 = -(uint)(fVar7 <= fVar9);
    local_18.x = (float)(~uVar3 & (uint)fVar7 | (uint)fVar9 & uVar3);
    uVar3 = -(uint)(fVar1 <= fVar6);
    local_18.y = (float)(~uVar3 & (uint)fVar1 | (uint)fVar6 & uVar3);
    fVar7 = (this->OuterRectClipped).Max.x;
    if (fVar7 <= fVar8) {
      fVar8 = fVar7;
    }
    fVar7 = (this->OuterRectClipped).Max.y;
    if (fVar7 <= fVar5) {
      fVar5 = fVar7;
    }
    IStack_10.y = fVar5;
    IStack_10.x = fVar8;
    PushClipRect(&local_18,&IStack_10,false);
    fVar4 = (this->DC).MenuBarOffset.x + fVar4;
    fVar7 = (this->DC).MenuBarOffset.y + IVar10.Min.y;
    (this->DC).CursorMaxPos.x = fVar4;
    (this->DC).CursorMaxPos.y = fVar7;
    (this->DC).CursorPos.x = fVar4;
    (this->DC).CursorPos.y = fVar7;
    (this->DC).LayoutType = 0;
    (this->DC).NavLayerCurrent = ImGuiNavLayer_Menu;
    (this->DC).MenuBarAppending = true;
    AlignTextToFramePadding();
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}